

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_sub_unsub_and_sub_with_refresh_conflated_into_one_sub_with_no_controls_Test
::
SubjectSetRegisterTest_test_sub_unsub_and_sub_with_refresh_conflated_into_one_sub_with_no_controls_Test
          (SubjectSetRegisterTest_test_sub_unsub_and_sub_with_refresh_conflated_into_one_sub_with_no_controls_Test
           *this)

{
  SubjectSetRegisterTest_test_sub_unsub_and_sub_with_refresh_conflated_into_one_sub_with_no_controls_Test
  *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &
       PTR__SubjectSetRegisterTest_test_sub_unsub_and_sub_with_refresh_conflated_into_one_sub_with_no_controls_Test_003db1e0
  ;
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_sub_unsub_and_sub_with_refresh_conflated_into_one_sub_with_no_controls)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Unregister(SS_SUBJECT0);
    subject_register.Register(SS_SUBJECT0, true);

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    EXPECT_TRUE(message->GetControls().empty());
    std::vector<Subject> set_comparison = {SS_SUBJECT0};
    EXPECT_EQ(set_comparison, message->GetSubjects());
}